

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

int aes_init_dec(aes_context *ctx,uint8_t *key,int bits)

{
  undefined8 uVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t *puVar4;
  uint32_t *puVar5;
  long lVar6;
  aes_context enc;
  
  if (bits == 0x80) {
    iVar2 = 10;
  }
  else {
    if (bits != 0x100) {
      return -1;
    }
    iVar2 = 0xe;
  }
  ctx->nr = iVar2;
  iVar2 = aes_init(&enc,key,bits);
  if (iVar2 < 0) {
    return -1;
  }
  lVar6 = (long)ctx->nr;
  puVar5 = enc.key + lVar6 * 4 + -1;
  uVar1 = *(undefined8 *)(enc.key + lVar6 * 4 + 2);
  *(undefined8 *)ctx->key = *(undefined8 *)(enc.key + lVar6 * 4);
  *(undefined8 *)(ctx->key + 2) = uVar1;
  puVar4 = ctx->key + 7;
  while( true ) {
    lVar6 = lVar6 + -1;
    if (lVar6 == 0) break;
    uVar3 = setup_mix2(puVar5[0xfffffffffffffffd]);
    puVar4[-3] = uVar3;
    uVar3 = setup_mix2(puVar5[0xfffffffffffffffe]);
    puVar4[-2] = uVar3;
    uVar3 = setup_mix2(puVar5[0xffffffffffffffff]);
    puVar4[-1] = uVar3;
    uVar3 = setup_mix2(*puVar5);
    *puVar4 = uVar3;
    puVar5 = puVar5 + 0xfffffffffffffffc;
    puVar4 = puVar4 + 4;
  }
  puVar4[-3] = puVar5[0xfffffffffffffffd];
  *(undefined8 *)(puVar4 + -2) = *(undefined8 *)(puVar5 + 0xfffffffffffffffe);
  *puVar4 = *puVar5;
  return 0;
}

Assistant:

int aes_init_dec(aes_context* ctx, const uint8_t* key, int bits)
{
    switch(bits) {
        case 128: ctx->nr = 10; break;
        case 256: ctx->nr = 14; break;
        default: return -1;
    }
#if PLATFORM_SUPPORTS_AESNI
    if (aes_supported_x86())
    {
        aes_init_dec_x86(ctx, key);
        return 0;
    }
#endif

    aes_context enc;
    if (aes_init(&enc, key, bits) < 0)
        return -1;

    uint32_t* ekey = enc.key + 4 * ctx->nr;
    uint32_t* dkey = ctx->key;

    *dkey++ = ekey[0];
    *dkey++ = ekey[1];
    *dkey++ = ekey[2];
    *dkey++ = ekey[3];
    ekey -= 4;

    for (size_t i = ctx->nr - 1; i > 0; i--)
    {
        *dkey++ = setup_mix2(ekey[0]);
        *dkey++ = setup_mix2(ekey[1]);
        *dkey++ = setup_mix2(ekey[2]);
        *dkey++ = setup_mix2(ekey[3]);
        ekey -= 4;
    }

    *dkey++ = ekey[0];
    *dkey++ = ekey[1];
    *dkey++ = ekey[2];
    *dkey++ = ekey[3];
    return 0;
}